

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int log_base2(int n)

{
  undefined4 local_10;
  undefined4 local_c;
  int k;
  int n_local;
  
  local_10 = 0;
  for (local_c = n; 1 < local_c; local_c = local_c >> 1) {
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

static int
log_base2(int n)
{
    int k = 0;
    while (n > 1) {
        ++k;
        n >>= 1;
    }
    return k;
}